

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  cmake *pcVar6;
  pointer ppVar7;
  ostream *poVar8;
  reference pbVar9;
  PolicyID id;
  PolicyID id_00;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  float local_4f0;
  cmListFileBacktrace local_4c0;
  string local_4a0;
  _Self local_480;
  _Self local_478;
  iterator iter_1;
  undefined1 local_450 [8];
  ostringstream w_1;
  cmListFileBacktrace local_2d8;
  string local_2b8;
  _Self local_298;
  _Self local_290;
  iterator iter;
  undefined1 local_268 [8];
  ostringstream w;
  cmListFileBacktrace local_f0;
  allocator local_c9;
  string local_c8;
  _Self local_a8;
  _Self local_a0;
  iterator it;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  uint local_14;
  cmGlobalGenerator *pcStack_10;
  uint i;
  cmGlobalGenerator *this_local;
  
  pcStack_10 = this;
  (*this->_vptr_cmGlobalGenerator[0x2b])();
  ProcessEvaluationFiles(this);
  for (local_14 = 0; uVar2 = (ulong)local_14,
      sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), uVar2 < sVar3; local_14 = local_14 + 1) {
    this_00 = &this->LocalGenerators;
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    SetCurrentMakefile(this,pcVar5);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    (*(*ppcVar4)->_vptr_cmLocalGenerator[2])();
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"CMAKE_SKIP_INSTALL_RULES",&local_39);
    bVar1 = cmMakefile::IsOn(pcVar5,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_14);
      cmLocalGenerator::GenerateInstallRules(*ppcVar4);
    }
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)local_14);
    cmLocalGenerator::GenerateTestFiles(*ppcVar4);
    pcVar6 = this->CMakeInstance;
    uVar2 = (ulong)local_14;
    sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    local_4f0 = (float)sVar3;
    cmake::UpdateProgress(pcVar6,"Generating",((float)uVar2 + 1.0) / local_4f0);
  }
  SetCurrentMakefile(this,(cmMakefile *)0x0);
  bVar1 = GenerateCPackPropertiesFile(this);
  if (!bVar1) {
    pcVar6 = GetCMakeInstance(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"Could not write CPack properties file.",&local_71);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&it);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_70,(cmListFileBacktrace *)&it);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&it);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::begin(&this->BuildExportSets);
  while( true ) {
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
         ::end(&this->BuildExportSets);
    bVar1 = std::operator!=(&local_a0,&local_a8);
    if (!bVar1) {
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0042WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&iter,(cmPolicies *)0x2a,id);
        poVar8 = std::operator<<((ostream *)local_268,(string *)&iter);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&iter);
        std::operator<<((ostream *)local_268,
                        "MACOSX_RPATH is not specified for the following targets:\n");
        local_290._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->CMP0042WarnTargets);
        while( true ) {
          local_298._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CMP0042WarnTargets);
          bVar1 = std::operator!=(&local_290,&local_298);
          if (!bVar1) break;
          poVar8 = std::operator<<((ostream *)local_268," ");
          pbVar9 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_290);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_290);
        }
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmListFileBacktrace::cmListFileBacktrace(&local_2d8);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_2b8,&local_2d8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0068WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&iter_1,(cmPolicies *)0x44,id_00);
        poVar8 = std::operator<<((ostream *)local_450,(string *)&iter_1);
        std::operator<<(poVar8,
                        "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                       );
        std::__cxx11::string::~string((string *)&iter_1);
        local_478._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->CMP0068WarnTargets);
        while( true ) {
          local_480._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CMP0068WarnTargets);
          bVar1 = std::operator!=(&local_478,&local_480);
          if (!bVar1) break;
          poVar8 = std::operator<<((ostream *)local_450," ");
          pbVar9 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_478);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_478);
        }
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmListFileBacktrace::cmListFileBacktrace(&local_4c0);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_4a0,&local_4c0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_4c0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      return;
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_a0);
    bVar1 = cmExportFileGenerator::GenerateImportFile(&ppVar7->second->super_cmExportFileGenerator);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
    ::operator++(&local_a0);
  }
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (bVar1) {
    return;
  }
  pcVar6 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"Could not write export file.",&local_c9);
  cmListFileBacktrace::cmListFileBacktrace(&local_f0);
  cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_c8,&local_f0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating", (static_cast<float>(i) + 1.0f) /
        static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(CM_NULLPTR);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator it =
         this->BuildExportSets.begin();
       it != this->BuildExportSets.end(); ++it) {
    if (!it->second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccuredFlag()) {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != CM_NULLPTR) {
    this->ExtraGenerator->Generate();
  }

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::set<std::string>::iterator iter =
           this->CMP0042WarnTargets.begin();
         iter != this->CMP0042WarnTargets.end(); ++iter) {
      w << " " << *iter << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::set<std::string>::iterator iter =
           this->CMP0068WarnTargets.begin();
         iter != this->CMP0068WarnTargets.end(); ++iter) {
      w << " " << *iter << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}